

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

DdNode * Llb_NonlinImage(Aig_Man_t *pAig,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vRoots,int *pVars2Q,
                        DdManager *dd,DdNode *bCurrent,int fReorder,int fVerbose,int *pOrder)

{
  Llb_Prt_t *pPart;
  int iVar1;
  int iVar2;
  abctime aVar3;
  abctime aVar4;
  Llb_Mgr_t *p;
  abctime aVar5;
  DdNode *n;
  DdNode *n_00;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  Llb_Prt_t *pPart1;
  Llb_Prt_t *local_40;
  Llb_Prt_t *local_38;
  
  aVar3 = Abc_Clock();
  aVar4 = Abc_Clock();
  p = Llb_NonlinAlloc(pAig,vLeaves,vRoots,pVars2Q,dd);
  iVar1 = Llb_NonlinStart(p);
  if (iVar1 == 0) {
LAB_00668a4c:
    Llb_NonlinFree(p);
    n = (DdNode *)0x0;
  }
  else {
    iVar1 = p->iPartFree;
    p->iPartFree = iVar1 + 1;
    Llb_NonlinAddPartition(p,iVar1,bCurrent);
    uVar9 = 0;
    uVar7 = (ulong)(uint)p->iPartFree;
    if (p->iPartFree < 1) {
      uVar7 = uVar9;
    }
    for (; uVar7 != uVar9; uVar9 = uVar9 + 1) {
      pPart = p->pParts[uVar9];
      if (pPart != (Llb_Prt_t *)0x0) {
        iVar1 = Llb_NonlinHasSingletonVars(p,pPart);
        if (iVar1 != 0) {
          Llb_NonlinQuantify1(p,pPart,0);
        }
      }
    }
    aVar5 = Abc_Clock();
    timeBuild = timeBuild + (aVar5 - aVar4);
    aVar5 = Abc_Clock();
    Llb_NonlinRecomputeScores(p);
    if (pOrder != (int *)0x0) {
      memcpy(pOrder,dd->invperm,(long)dd->size << 2);
    }
    lVar8 = aVar5 - aVar4;
    while( true ) {
      iVar1 = Llb_NonlinNextPartitions(p,&local_38,&local_40);
      if (iVar1 == 0) break;
      aVar4 = Abc_Clock();
      iVar1 = Cudd_ReadReorderings(dd);
      iVar2 = Llb_NonlinQuantify2(p,local_38,local_40);
      if (iVar2 == 0) goto LAB_00668a4c;
      aVar5 = Abc_Clock();
      timeAndEx = timeAndEx + (aVar5 - aVar4);
      aVar5 = Abc_Clock();
      lVar8 = ((int)lVar8 - aVar4) + aVar5;
      iVar2 = Cudd_ReadReorderings(dd);
      if (iVar1 < iVar2) {
        Llb_NonlinRecomputeScores(p);
      }
    }
    n = Cudd_ReadOne(p->dd);
    Cudd_Ref(n);
    for (lVar6 = 0; lVar6 < p->iPartFree; lVar6 = lVar6 + 1) {
      n_00 = n;
      if (p->pParts[lVar6] != (Llb_Prt_t *)0x0) {
        n_00 = Cudd_bddAnd(p->dd,n,p->pParts[lVar6]->bFunc);
        Cudd_Ref(n_00);
        Cudd_RecursiveDeref(p->dd,n);
      }
      n = n_00;
    }
    nSuppMax = p->nSuppMax;
    Llb_NonlinFree(p);
    if (fReorder != 0) {
      Llb_NonlinReorder(dd,0,fVerbose);
    }
    aVar4 = Abc_Clock();
    timeOther = timeOther + (aVar4 - ((int)lVar8 + aVar3));
    Cudd_Deref(n);
  }
  return n;
}

Assistant:

DdNode * Llb_NonlinImage( Aig_Man_t * pAig, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vRoots, int * pVars2Q, 
    DdManager * dd, DdNode * bCurrent, int fReorder, int fVerbose, int * pOrder )
{
    Llb_Prt_t * pPart, * pPart1, * pPart2;
    Llb_Mgr_t * p;
    DdNode * bFunc, * bTemp;
    int i, nReorders, timeInside;
    abctime clk = Abc_Clock(), clk2;
    // start the manager
    clk2 = Abc_Clock();
    p = Llb_NonlinAlloc( pAig, vLeaves, vRoots, pVars2Q, dd );
    if ( !Llb_NonlinStart( p ) )
    {
        Llb_NonlinFree( p );
        return NULL;
    }
    // add partition
    Llb_NonlinAddPartition( p, p->iPartFree++, bCurrent );
    // remove singles
    Llb_MgrForEachPart( p, pPart, i )
        if ( Llb_NonlinHasSingletonVars(p, pPart) )
            Llb_NonlinQuantify1( p, pPart, 0 );
    timeBuild += Abc_Clock() - clk2;
    timeInside = Abc_Clock() - clk2;
    // compute scores
    Llb_NonlinRecomputeScores( p );
    // save permutation
    if ( pOrder )
    memcpy( pOrder, dd->invperm, sizeof(int) * dd->size );
    // iteratively quantify variables
    while ( Llb_NonlinNextPartitions(p, &pPart1, &pPart2) )
    {
        clk2 = Abc_Clock();
        nReorders = Cudd_ReadReorderings(dd);
        if ( !Llb_NonlinQuantify2( p, pPart1, pPart2 ) )
        {
            Llb_NonlinFree( p );
            return NULL;
        }
        timeAndEx  += Abc_Clock() - clk2;
        timeInside += Abc_Clock() - clk2;
        if ( nReorders < Cudd_ReadReorderings(dd) )
            Llb_NonlinRecomputeScores( p );
//        else
//            Llb_NonlinVerifyScores( p );
    }
    // load partitions
    bFunc = Cudd_ReadOne(p->dd);   Cudd_Ref( bFunc );
    Llb_MgrForEachPart( p, pPart, i )
    {
        bFunc = Cudd_bddAnd( p->dd, bTemp = bFunc, pPart->bFunc );   Cudd_Ref( bFunc );
        Cudd_RecursiveDeref( p->dd, bTemp );
    }
    nSuppMax = p->nSuppMax;
    Llb_NonlinFree( p );
    // reorder variables
    if ( fReorder )
        Llb_NonlinReorder( dd, 0, fVerbose );
    timeOther += Abc_Clock() - clk - timeInside;
    // return
    Cudd_Deref( bFunc );
    return bFunc;
}